

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

InstanceBodySymbol *
slang::ast::InstanceBodySymbol::fromDefinition
          (Compilation *compilation,DefinitionSymbol *definition,SourceLocation instanceLoc,
          bitmask<slang::ast::InstanceFlags> flags,HierarchyOverrideNode *hierarchyOverrideNode,
          ConfigBlockSymbol *configBlock,ConfigRule *configRule)

{
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  string_view definitionName;
  bool set;
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *__range;
  InstanceBodySymbol *pIVar1;
  Symbol *in_RSI;
  HierarchyOverrideNode *in_R8;
  long in_R9;
  long in_stack_00000008;
  ParameterBuilder *in_stack_00000050;
  DefinitionSymbol *in_stack_00000058;
  Compilation *in_stack_00000060;
  bitmask<slang::ast::InstanceFlags> in_stack_0000006f;
  ParameterBuilder paramBuilder;
  undefined1 in_stack_000004af;
  ParameterValueAssignmentSyntax *in_stack_000004b0;
  ParameterBuilder *in_stack_000004b8;
  Scope *in_stack_fffffffffffffdc8;
  ParameterBuilder *in_stack_fffffffffffffdd0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffde0;
  ParameterBuilder *this;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  bitmask<slang::ast::InstanceFlags> local_1e9 [17];
  size_t local_1d8;
  char *pcStack_1d0;
  ParameterBuilder local_1c8;
  long local_30;
  HierarchyOverrideNode *local_28;
  Symbol *local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RSI;
  __range = (SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *)
            Symbol::getParentScope(in_RSI);
  local_1d8 = (local_20->name)._M_len;
  pcStack_1d0 = (local_20->name)._M_str;
  std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
  span<const_slang::SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL>_&>
            ((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *)
             in_stack_fffffffffffffde0._M_extent_value,__range);
  this = &local_1c8;
  definitionName._M_str._0_7_ = in_stack_fffffffffffffdf0;
  definitionName._M_len = (size_t)this;
  definitionName._M_str._7_1_ = in_stack_fffffffffffffdf7;
  parameterDecls._M_extent._M_extent_value = in_stack_fffffffffffffde0._M_extent_value;
  parameterDecls._M_ptr = (pointer)__range;
  ParameterBuilder::ParameterBuilder
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,definitionName,parameterDecls);
  bitmask<slang::ast::InstanceFlags>::bitmask(local_1e9,Uninstantiated);
  set = bitmask<slang::ast::InstanceFlags>::has
                  ((bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffdd0,
                   (bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffdc8);
  ParameterBuilder::setForceInvalidValues(this,set);
  if (local_28 != (HierarchyOverrideNode *)0x0) {
    ParameterBuilder::setOverrides(&local_1c8,local_28);
  }
  if ((in_stack_00000008 != 0) && (*(long *)(in_stack_00000008 + 0x50) != 0)) {
    ParameterBuilder::setConfigScope(&local_1c8,(Scope *)(local_30 + 0x40));
    ParameterBuilder::setAssignments(in_stack_000004b8,in_stack_000004b0,(bool)in_stack_000004af);
  }
  pIVar1 = fromDefinition(in_stack_00000060,in_stack_00000058,(SourceLocation)paramBuilder.scope,
                          in_stack_00000050,in_stack_0000006f);
  ParameterBuilder::~ParameterBuilder((ParameterBuilder *)0x39dc99);
  return pIVar1;
}

Assistant:

InstanceBodySymbol& InstanceBodySymbol::fromDefinition(
    Compilation& compilation, const DefinitionSymbol& definition, SourceLocation instanceLoc,
    bitmask<InstanceFlags> flags, const HierarchyOverrideNode* hierarchyOverrideNode,
    const ConfigBlockSymbol* configBlock, const ConfigRule* configRule) {

    ParameterBuilder paramBuilder(*definition.getParentScope(), definition.name,
                                  definition.parameters);
    paramBuilder.setForceInvalidValues(flags.has(InstanceFlags::Uninstantiated));
    if (hierarchyOverrideNode)
        paramBuilder.setOverrides(hierarchyOverrideNode);

    if (configRule && configRule->paramOverrides) {
        SLANG_ASSERT(configBlock);
        paramBuilder.setConfigScope(*configBlock);
        paramBuilder.setAssignments(*configRule->paramOverrides, /* isFromConfig */ true);
    }

    return fromDefinition(compilation, definition, instanceLoc, paramBuilder, flags);
}